

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O1

int print_insn_m68k(bfd_vma memaddr,disassemble_info *info)

{
  int iVar1;
  ulong uVar2;
  uint arch_mask;
  private priv;
  ushort *local_38;
  ushort local_30 [12];
  bfd_vma local_18;
  
  local_38 = local_30;
  info->private_data = &local_38;
  uVar2 = info->mach & 0xffffffff;
  local_18 = memaddr;
  if ((info->mach & 0xffffffe0) == 0 && uVar2 != 0) {
    arch_mask = m68k_arch_features[uVar2];
  }
  else {
    iVar1 = m68k_scan_mask(memaddr,info,0x3ff);
    if (0 < iVar1) goto LAB_0012c7b7;
    arch_mask = 0x7e400;
  }
  iVar1 = m68k_scan_mask(memaddr,info,arch_mask);
LAB_0012c7b7:
  if (iVar1 == 0) {
    (*info->fprintf_func)
              (info->stream,".short %d",(ulong)(ushort)(local_30[0] << 8 | local_30[0] >> 8));
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int
print_insn_m68k (bfd_vma memaddr, disassemble_info *info)
{
  unsigned int arch_mask;
  struct private priv;
  int val;

  bfd_byte *buffer = priv.the_buffer;

  info->private_data = & priv;
  #if 0
  /* Tell objdump to use two bytes per chunk
     and six bytes per line for displaying raw data.  */
  info->bytes_per_chunk = 2;
  info->bytes_per_line = 6;
  info->display_endian = BFD_ENDIAN_BIG;
  #endif
  priv.max_fetched = priv.the_buffer;
  priv.insn_start = memaddr;
#if 0
  info->insn_info_valid = 1;
  info->branch_delay_insns = 0;
  info->data_size = 0;
  info->target = -1; /* 0 is bad then visualize_jumps would think it's a jump to 0x00000000 */
  info->target2 = -1;
#endif

  #if 0
  if (info->disassembler_options)
    {
      parse_disassembler_options (info->disassembler_options);

      /* To avoid repeated parsing of these options, we remove them here.  */
      info->disassembler_options = NULL;
    }
  #endif

  arch_mask = bfd_m68k_mach_to_features (info->mach);
  if (!arch_mask)
    {
      /* First try printing an m680x0 instruction.  Try printing a Coldfire
	 one if that fails.  */
      val = m68k_scan_mask (memaddr, info, m68k_mask);
      if (val <= 0)
	val = m68k_scan_mask (memaddr, info, mcf_mask);
    }
  else
    {
      val = m68k_scan_mask (memaddr, info, arch_mask);
    }

  if (val == 0)
    /* Handle undefined instructions.  */
    // info->fprintf_func (info->stream, ".short 0x%04x", (buffer[0] << 8) + buffer[1]); // DIRK
    info->fprintf_func (info->stream, ".short %d", (buffer[0] << 8) + buffer[1]);

  return val ? val : 2;
}